

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

size_t EmitArgs(ParseNode *pnode,BOOL fAssignRegs,ByteCodeGenerator *byteCodeGenerator,
               FuncInfo *funcInfo,ProfileId callSiteId,bool emitProfiledArgouts,
               AuxArray<unsigned_int> *spreadIndices)

{
  OpCode OVar1;
  size_t sVar2;
  ParseNodeBin *pPVar3;
  ArgSlot local_34;
  ArgSlot local_32 [3];
  ArgSlot argIndex;
  ArgSlot spreadIndex;
  
  sVar2 = 0;
  local_34 = 0;
  local_32[0] = 0;
  if (pnode != (ParseNode *)0x0) {
    OVar1 = pnode->nop;
    while (OVar1 == knopList) {
      pPVar3 = ParseNode::AsParseNodeBin(pnode);
      EmitOneArg(pPVar3->pnode1,fAssignRegs,byteCodeGenerator,funcInfo,callSiteId,&local_34,local_32
                 ,0xffffffff,emitProfiledArgouts,spreadIndices);
      pPVar3 = ParseNode::AsParseNodeBin(pnode);
      pnode = pPVar3->pnode2;
      OVar1 = pnode->nop;
    }
    EmitOneArg(pnode,fAssignRegs,byteCodeGenerator,funcInfo,callSiteId,&local_34,local_32,0xffffffff
               ,emitProfiledArgouts,spreadIndices);
    sVar2 = (size_t)local_34;
  }
  return sVar2;
}

Assistant:

size_t EmitArgs(
    ParseNode *pnode,
    BOOL fAssignRegs,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo,
    Js::ProfileId callSiteId,
    bool emitProfiledArgouts,
    Js::AuxArray<uint32> *spreadIndices = nullptr
    )
{
    Js::ArgSlot argIndex = 0;
    Js::ArgSlot spreadIndex = 0;

    if (pnode != nullptr)
    {
        while (pnode->nop == knopList)
        {
            EmitOneArg(pnode->AsParseNodeBin()->pnode1, fAssignRegs, byteCodeGenerator, funcInfo, callSiteId, argIndex, spreadIndex, Js::Constants::NoRegister, emitProfiledArgouts, spreadIndices);
            pnode = pnode->AsParseNodeBin()->pnode2;
        }

        EmitOneArg(pnode, fAssignRegs, byteCodeGenerator, funcInfo, callSiteId, argIndex, spreadIndex, Js::Constants::NoRegister, emitProfiledArgouts, spreadIndices);
    }

    return argIndex;
}